

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

void ts_external_scanner_state_init(ExternalScannerState *self,char *data,uint length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ExternalScannerState *pEVar4;
  void *__dest;
  undefined8 *__size;
  char *pcVar5;
  undefined8 *__size_00;
  
  self->length = length;
  __size = (undefined8 *)(ulong)length;
  if (0x18 < length) {
    pcVar5 = data;
    pEVar4 = (ExternalScannerState *)malloc((size_t)__size);
    if (pEVar4 == (ExternalScannerState *)0x0) {
      ts_external_scanner_state_init_cold_1();
      uVar1 = *(undefined8 *)pcVar5;
      uVar2 = *(undefined8 *)(pcVar5 + 8);
      uVar3 = *(undefined8 *)(pcVar5 + 0x18);
      __size[2] = *(undefined8 *)(pcVar5 + 0x10);
      __size[3] = uVar3;
      *__size = uVar1;
      __size[1] = uVar2;
      __size_00 = (undefined8 *)(ulong)*(uint *)(pcVar5 + 0x18);
      if (&DAT_00000018 < __size_00) {
        __dest = malloc((size_t)__size_00);
        if (__dest == (void *)0x0) {
          ts_external_scanner_state_copy_cold_1();
          if (*(uint *)(__size_00 + 3) < 0x19) {
            return;
          }
          free((void *)*__size_00);
          return;
        }
        *__size = __dest;
        memcpy(__dest,*(void **)pcVar5,(size_t)__size_00);
      }
      return;
    }
    (self->field_0).long_data = (char *)pEVar4;
    self = pEVar4;
  }
  memcpy(self,data,(size_t)__size);
  return;
}

Assistant:

void ts_external_scanner_state_init(ExternalScannerState *self, const char *data, unsigned length) {
  self->length = length;
  if (length > sizeof(self->short_data)) {
    self->long_data = ts_malloc(length);
    memcpy(self->long_data, data, length);
  } else {
    memcpy(self->short_data, data, length);
  }
}